

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

void GenCodeCmdMemCopy(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  CodeGenRegVmContext *ctx_local;
  RegVmCmd cmd_local;
  
  ctx_local._4_4_ = cmd.argument;
  if (((ulong)cmd & 0x300000000) != 0) {
    __assert_fail("cmd.argument % 4 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGenRegVm_X86.cpp"
                  ,0x651,"void GenCodeCmdMemCopy(CodeGenRegVmContext &, RegVmCmd)");
  }
  ctx_local._3_1_ = cmd.rC;
  if (ctx_local._3_1_ == 1) {
    EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rESI,rR15);
  }
  else if (ctx_local._3_1_ == 2) {
    EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rESI,rR14);
  }
  else if (ctx_local._3_1_ == 3) {
    EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rESI,rEBX);
  }
  else {
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rESI,sQWORD,rEBX,(uint)ctx_local._3_1_ << 3);
  }
  ctx_local._1_1_ = cmd.rA;
  if (ctx_local._1_1_ == 1) {
    EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rEDI,rR15);
  }
  else if (ctx_local._1_1_ == 2) {
    EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rEDI,rR14);
  }
  else if (ctx_local._1_1_ == 3) {
    EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rEDI,rEBX);
  }
  else {
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEDI,sQWORD,rEBX,(uint)ctx_local._1_1_ << 3);
  }
  EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rECX,ctx_local._4_4_ >> 2);
  EMIT_OP(&ctx->ctx,o_rep_movsd);
  return;
}

Assistant:

void GenCodeCmdMemCopy(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
	assert(cmd.argument % 4 == 0);

#if defined(_M_X64)
	// Load source pointer

	if(cmd.rC == rvrrFrame)
		EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRSI, rR15);
	else if(cmd.rC == rvrrConstants)
		EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRSI, rR14);
	else if(cmd.rC == rvrrRegisters)
		EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRSI, rRBX);
	else
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRSI, sQWORD, rREG, cmd.rC * 8);

	// Load target pointer
	if(cmd.rA == rvrrFrame)
		EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRDI, rR15);
	else if(cmd.rA == rvrrConstants)
		EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRDI, rR14);
	else if(cmd.rA == rvrrRegisters)
		EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRDI, rRBX);
	else
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, cmd.rA * 8);

	EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument >> 2);
	EMIT_OP(ctx.ctx, o_rep_movsd);
#else
	EMIT_OP_REG_REG(ctx.ctx, o_mov, rEDX, rESI);
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rESI, sDWORD, rREG, cmd.rC * 8); // Load source pointer
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDI, sDWORD, rREG, cmd.rA * 8); // Load target pointer
	EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument >> 2);
	EMIT_OP(ctx.ctx, o_rep_movsd);
	EMIT_OP_REG_REG(ctx.ctx, o_mov, rESI, rEDX);
	EMIT_REG_READ(ctx.ctx, rESI);
#endif
}